

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

fdb_status compactor_register_file(filemgr *file,fdb_config *config,err_log_callback *log_callback)

{
  __int_type_conflict1 _Var1;
  fdb_status fVar2;
  avl_node *paVar3;
  char *pcVar4;
  err_log_callback *log_callback_00;
  compactor_meta meta;
  openfiles_elem_conflict query;
  char path [1024];
  compactor_meta local_d70;
  char local_968 [1296];
  avl_node local_458 [2];
  char local_428 [1024];
  
  _Var1 = (file->status).super___atomic_base<unsigned_char>._M_i;
  fVar2 = FDB_RESULT_SUCCESS;
  if ((_Var1 != '\x01') && (fVar2 = FDB_RESULT_SUCCESS, _Var1 != '\x04')) {
    strcpy(local_968,file->filename);
    pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
    paVar3 = avl_search(&openfiles,local_458,_compactor_cmp);
    if (paVar3 == (avl_node *)0x0) {
      pcVar4 = (char *)calloc(1,0x540);
      strcpy(pcVar4,file->filename);
      *(filemgr **)(pcVar4 + 0x400) = file;
      memcpy(pcVar4 + 0x408,config,0xf8);
      pcVar4[0x434] = '\0';
      pcVar4[0x500] = '\x01';
      pcVar4[0x501] = '\0';
      pcVar4[0x502] = '\0';
      pcVar4[0x503] = '\0';
      pcVar4[0x504] = '\0';
      pcVar4[0x505] = '\0';
      pcVar4[0x506] = '\0';
      *(err_log_callback **)(pcVar4 + 0x508) = log_callback;
      gettimeofday((timeval *)(pcVar4 + 0x528),(__timezone_ptr_t)0x0);
      *(size_t *)(pcVar4 + 0x538) = sleep_duration;
      avl_insert(&openfiles,(avl_node *)(pcVar4 + 0x510),_compactor_cmp);
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
      pcVar4 = file->filename;
      _compactor_convert_dbfile_to_metafile(pcVar4,local_428);
      _strcpy_fname(local_d70.filename,pcVar4);
      fVar2 = _compactor_store_metafile(local_428,&local_d70,log_callback_00);
    }
    else {
      if (paVar3[-0xc].right == (avl_node *)0x0) {
        paVar3[-0xc].right = (avl_node *)file;
      }
      *(int *)&paVar3[-1].left = *(int *)&paVar3[-1].left + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    }
  }
  return fVar2;
}

Assistant:

fdb_status compactor_register_file(struct filemgr *file,
                                   fdb_config *config,
                                   err_log_callback *log_callback)
{
    file_status_t fstatus;
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    // Ignore files whose status is COMPACT_OLD or REMOVED_PENDING.
    // Those files do not need to be compacted again.
    fstatus = filemgr_get_file_status(file);
    if (fstatus == FILE_COMPACT_OLD ||
        fstatus == FILE_REMOVED_PENDING) {
        return fs;
    }

    strcpy(query.filename, file->filename);
    // first search the existing file
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a == NULL) {
        // doesn't exist
        // create elem and insert into tree
        char path[MAX_FNAMELEN];
        struct compactor_meta meta;

        elem = (struct openfiles_elem *)calloc(1, sizeof(struct openfiles_elem));
        strcpy(elem->filename, file->filename);
        elem->file = file;
        elem->config = *config;
        elem->config.cleanup_cache_onclose = false; // prevent MB-16422
        elem->register_count = 1;
        elem->compaction_flag = false;
        elem->daemon_compact_in_progress = false;
        elem->removal_activated = false;
        elem->log_callback = log_callback;
        gettimeofday(&elem->last_compaction_timestamp, NULL);
        // Init the compaction interval using the global param
        elem->interval = sleep_duration;
        avl_insert(&openfiles, &elem->avl, _compactor_cmp);
        mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as
                                 // subsequent registration attempts for the same file
                                 // will be simply processed by incrementing its
                                 // counter below.

        // store in metafile
        _compactor_convert_dbfile_to_metafile(file->filename, path);
        _strcpy_fname(meta.filename, file->filename);
        fs = _compactor_store_metafile(path, &meta, log_callback);
    } else {
        // already exists
        elem = _get_entry(a, struct openfiles_elem, avl);
        if (!elem->file) {
            elem->file = file;
        }
        elem->register_count++;
        mutex_unlock(&cpt_lock);
    }
    return fs;
}